

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

CImgDisplay * __thiscall cimg_library::CImgDisplay::show(CImgDisplay *this)

{
  Display *pDVar1;
  int iVar2;
  CImgDisplay *pCVar3;
  
  if (((this->_width != 0) && (this->_height != 0)) && (this->_is_closed == true)) {
    if (cimg::X11_attr()::val == '\0') {
      iVar2 = __cxa_guard_acquire(&cimg::X11_attr()::val);
      if (iVar2 != 0) {
        cimg::X11_info::X11_info(&cimg::X11_attr::val);
        __cxa_atexit(cimg::X11_info::~X11_info,&cimg::X11_attr::val,&__dso_handle);
        __cxa_guard_release(&cimg::X11_attr()::val);
      }
    }
    pDVar1 = cimg::X11_attr::val.display;
    XLockDisplay(cimg::X11_attr::val.display);
    if (this->_is_fullscreen == true) {
      _init_fullscreen(this);
    }
    _map_window(this);
    this->_is_closed = false;
    XUnlockDisplay(pDVar1);
    pCVar3 = paint(this,true);
    return pCVar3;
  }
  return this;
}

Assistant:

CImgDisplay& show() {
      if (is_empty() || !_is_closed) return *this;
      Display *const dpy = cimg::X11_attr().display;
      XLockDisplay(dpy);
      if (_is_fullscreen) _init_fullscreen();
      _map_window();
      _is_closed = false;
      XUnlockDisplay(dpy);
      return paint();
    }